

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_LevelMixer.cpp
# Opt level: O2

int LevelMixer::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  EffectData *pEVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  float gains [8];
  float afStack_58 [10];
  
  pEVar1 = UnityAudioEffectState::GetEffectData<LevelMixer::EffectData>(state);
  uVar4 = 0;
  uVar6 = 0;
  if (0 < inchannels) {
    uVar6 = (ulong)(uint)inchannels;
  }
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    fVar7 = powf(10.0,*(float *)((long)&pEVar1->field_0 + uVar4 * 4) * 0.05);
    afStack_58[uVar4] = fVar7;
  }
  iVar2 = 0;
  for (uVar3 = 0; uVar3 != length; uVar3 = uVar3 + 1) {
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      uVar5 = iVar2 + (int)uVar4;
      outbuffer[uVar5] = inbuffer[uVar5] * afStack_58[uVar4];
    }
    iVar2 = iVar2 + inchannels;
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        float gains[8];
        for (int i = 0; i < inchannels; i++)
            gains[i] = powf(10.0f, data->p[P_GAIN1 + i] * 0.05f);

        for (unsigned int n = 0; n < length; n++)
            for (int i = 0; i < inchannels; i++)
                outbuffer[n * inchannels + i] = inbuffer[n * inchannels + i] * gains[i];

        return UNITY_AUDIODSP_OK;
    }